

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O0

ssize_t sf_parse_bare_item(nghttp2_sf_value *dest,uint8_t *begin,uint8_t *end)

{
  uint8_t *end_local;
  uint8_t *begin_local;
  nghttp2_sf_value *dest_local;
  
  switch(*begin) {
  case '\"':
    dest_local = (nghttp2_sf_value *)sf_parse_string(dest,begin,end);
    break;
  default:
    if (((*begin < 0x41) || (0x5a < *begin)) && ((*begin < 0x61 || (0x7a < *begin)))) {
      dest_local = (nghttp2_sf_value *)0xffffffffffffffff;
    }
    else {
      dest_local = (nghttp2_sf_value *)sf_parse_token(dest,begin,end);
    }
    break;
  case '*':
    dest_local = (nghttp2_sf_value *)sf_parse_token(dest,begin,end);
    break;
  case '-':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    dest_local = (nghttp2_sf_value *)sf_parse_integer_or_decimal(dest,begin,end);
    break;
  case ':':
    dest_local = (nghttp2_sf_value *)sf_parse_byteseq(dest,begin,end);
    break;
  case '?':
    dest_local = (nghttp2_sf_value *)sf_parse_boolean(dest,begin,end);
  }
  return (ssize_t)dest_local;
}

Assistant:

static ssize_t sf_parse_bare_item(nghttp2_sf_value *dest, const uint8_t *begin,
                                  const uint8_t *end) {
  switch (*begin) {
  case '-':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    return sf_parse_integer_or_decimal(dest, begin, end);
  case '"':
    return sf_parse_string(dest, begin, end);
  case '*':
    return sf_parse_token(dest, begin, end);
  case ':':
    return sf_parse_byteseq(dest, begin, end);
  case '?':
    return sf_parse_boolean(dest, begin, end);
  default:
    if (('A' <= *begin && *begin <= 'Z') || ('a' <= *begin && *begin <= 'z')) {
      return sf_parse_token(dest, begin, end);
    }
    return -1;
  }
}